

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

string * __thiscall
bidfx_public_api::tools::Base64Encode_abi_cxx11_
          (string *__return_storage_ptr__,tools *this,char *bytes_to_encode,unsigned_long in_len)

{
  undefined6 uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  ulong in_RAX;
  byte bVar5;
  int iVar6;
  int iVar7;
  char cVar8;
  uint uVar9;
  long lVar11;
  ulong uVar12;
  uchar char_array_3 [3];
  uchar char_array_4 [4];
  undefined8 local_38;
  ulong uVar10;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (bytes_to_encode != (char *)0x0) {
    uVar12 = 0;
    local_38 = in_RAX;
    do {
      uVar2 = local_38;
      uVar9 = (int)uVar12 + 1;
      uVar10 = (ulong)uVar9;
      *(tools *)((long)&local_38 + uVar12 + 1) = *this;
      cVar8 = (char)__return_storage_ptr__;
      if (uVar9 == 3) {
        bVar3 = local_38._1_1_;
        bVar4 = local_38._2_1_;
        bVar5 = local_38._1_1_ >> 2;
        local_38._0_5_ = CONCAT14(bVar5,(undefined4)local_38);
        local_38._0_6_ = CONCAT15((bVar3 & 3) << 4 | bVar4 >> 4,(undefined5)local_38);
        uVar1 = (undefined6)local_38;
        local_38._3_1_ = SUB81(uVar2,3);
        bVar3 = local_38._3_1_;
        local_38._0_7_ = CONCAT16((bVar4 & 0xf) << 2 | local_38._3_1_ >> 6,uVar1);
        local_38 = CONCAT17(bVar3,(undefined7)local_38) & 0x3fffffffffffffff;
        lVar11 = 0;
        do {
          std::__cxx11::string::push_back(cVar8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        uVar10 = 0;
      }
      bytes_to_encode = bytes_to_encode + -1;
      this = this + 1;
      uVar12 = uVar10;
    } while (bytes_to_encode != (char *)0x0);
    iVar7 = (int)uVar10;
    if (iVar7 != 0) {
      if (iVar7 < 3) {
        memset((void *)((long)&local_38 + uVar10 + 1),0,(ulong)(2 - iVar7) + 1);
      }
      uVar12 = local_38;
      bVar3 = local_38._1_1_;
      bVar4 = local_38._2_1_;
      bVar5 = local_38._1_1_ >> 2;
      local_38._0_5_ = CONCAT14(bVar5,(undefined4)local_38);
      local_38._0_6_ = CONCAT15((bVar3 & 3) << 4 | bVar4 >> 4,(undefined5)local_38);
      uVar1 = (undefined6)local_38;
      local_38._3_1_ = SUB81(uVar12,3);
      local_38._7_1_ = SUB81(uVar12,7);
      local_38._0_7_ = CONCAT16((bVar4 & 0xf) << 2 | local_38._3_1_ >> 6,uVar1);
      if (-1 < iVar7) {
        uVar12 = 0;
        do {
          std::__cxx11::string::push_back(cVar8);
          uVar12 = uVar12 + 1;
        } while (iVar7 + 1 != uVar12);
      }
      iVar6 = 3;
      if (3 < iVar7) {
        iVar6 = iVar7;
      }
      iVar7 = (iVar6 - iVar7) + 1;
      while (iVar7 = iVar7 + -1, iVar7 != 0) {
        std::__cxx11::string::push_back(cVar8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Base64Encode(char const* bytes_to_encode, unsigned long in_len)
{
    std::string ret;
    int i = 0;
    int j = 0;
    unsigned char char_array_3[3];
    unsigned char char_array_4[4];

    while (in_len--)
    {
        char_array_3[i++] = *(bytes_to_encode++);
        if (i == 3)
        {
            char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
            char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
            char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
            char_array_4[3] = char_array_3[2] & 0x3f;

            for (i = 0; (i < 4); i++)
                ret += base64_chars[char_array_4[i]];
            i = 0;
        }
    }

    if (i)
    {
        for (j = i; j < 3; j++)
            char_array_3[j] = '\0';

        char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
        char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
        char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);

        for (j = 0; (j < i + 1); j++)
            ret += base64_chars[char_array_4[j]];

        while ((i++ < 3))
            ret += '=';

    }

    return ret;

}